

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

strbuf * term_input_data_from_charset(Terminal *term,wchar_t codepage,char *str,wchar_t len)

{
  wchar_t len_00;
  wchar_t *wcstr;
  wchar_t widelen;
  wchar_t *widebuf;
  strbuf *psStack_30;
  wchar_t widesize;
  strbuf *buf;
  wchar_t len_local;
  char *str_local;
  wchar_t codepage_local;
  Terminal *term_local;
  
  if (codepage < L'\0') {
    psStack_30 = strbuf_new();
    BinarySink_put_data(psStack_30->binarysink_,str,(long)len);
  }
  else {
    wcstr = (wchar_t *)safemalloc((long)(len << 1),4,0);
    len_00 = mb_to_wc(codepage,L'\0',str,len,wcstr,len << 1);
    psStack_30 = term_input_data_from_unicode(term,wcstr,len_00);
    safefree(wcstr);
  }
  return psStack_30;
}

Assistant:

static strbuf *term_input_data_from_charset(
    Terminal *term, int codepage, const char *str, int len)
{
    strbuf *buf;

    if (codepage < 0) {
        buf = strbuf_new();
        put_data(buf, str, len);
    } else {
        int widesize = len * 2;        /* allow for UTF-16 surrogates */
        wchar_t *widebuf = snewn(widesize, wchar_t);
        int widelen = mb_to_wc(codepage, 0, str, len, widebuf, widesize);
        buf = term_input_data_from_unicode(term, widebuf, widelen);
        sfree(widebuf);
    }

    return buf;
}